

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O3

void __thiscall
Catch::
BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[8]>
::streamReconstructedExpression
          (BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[8]>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  Detail *this_00;
  void *pvVar2;
  size_type in_RCX;
  char *pcVar3;
  string *in_R9;
  StringRef op;
  StringRef string;
  string local_68;
  string local_48;
  
  StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::convert(&local_48,this->m_lhs);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  this_00 = (Detail *)this->m_rhs;
  pvVar2 = memchr(this_00,0,8);
  pcVar3 = (char *)((long)pvVar2 - (long)this_00);
  if (pvVar2 == (void *)0x0) {
    pcVar3 = (char *)0x8;
  }
  string.m_size = in_RCX;
  string.m_start = pcVar3;
  Detail::convertIntoString_abi_cxx11_(&local_68,this_00,string);
  op.m_size = (size_type)&local_68;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_48,lhs,op,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }